

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_sptfqmr.c
# Opt level: O2

SUNErrCode
SUNLinSolSetPreconditioner_SPTFQMR
          (SUNLinearSolver S,void *PData,SUNPSetupFn Psetup,SUNPSolveFn Psolve)

{
  void *pvVar1;
  
  pvVar1 = S->content;
  *(SUNPSetupFn *)((long)pvVar1 + 0x30) = Psetup;
  *(SUNPSolveFn *)((long)pvVar1 + 0x38) = Psolve;
  *(void **)((long)pvVar1 + 0x40) = PData;
  return 0;
}

Assistant:

SUNErrCode SUNLinSolSetPreconditioner_SPTFQMR(SUNLinearSolver S, void* PData,
                                              SUNPSetupFn Psetup,
                                              SUNPSolveFn Psolve)
{
  /* set function pointers to integrator-supplied Psetup and PSolve
     routines and data, and return with success */
  SPTFQMR_CONTENT(S)->Psetup = Psetup;
  SPTFQMR_CONTENT(S)->Psolve = Psolve;
  SPTFQMR_CONTENT(S)->PData  = PData;
  return SUN_SUCCESS;
}